

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O2

void __thiscall duckdb::TaskScheduler::ExecuteTasks(TaskScheduler *this,idx_t max_tasks)

{
  uint uVar1;
  pointer pCVar2;
  Task *pTVar3;
  InternalException *this_00;
  bool bVar4;
  allocator local_59;
  shared_ptr<duckdb::Task,_true> task;
  string local_48;
  
  task.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  task.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while (bVar4 = max_tasks != 0, max_tasks = max_tasks - 1, bVar4) {
    pCVar2 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
             ::operator->(&this->queue);
    duckdb_moodycamel::LightweightSemaphore::wait(&pCVar2->semaphore,(void *)0x1388);
    pCVar2 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
             ::operator->(&this->queue);
    bVar4 = duckdb_moodycamel::
            ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
            ::try_dequeue<duckdb::shared_ptr<duckdb::Task,true>>
                      ((ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                        *)pCVar2,&task);
    if (!bVar4) break;
    pTVar3 = shared_ptr<duckdb::Task,_true>::operator->(&task);
    uVar1 = (*pTVar3->_vptr_Task[2])(pTVar3,0);
    switch(uVar1 & 0xff) {
    case 1:
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_48,"Task should not return TASK_NOT_FINISHED in PROCESS_ALL mode",
                 &local_59);
      InternalException::InternalException(this_00,&local_48);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case 3:
      pTVar3 = shared_ptr<duckdb::Task,_true>::operator->(&task);
      (*pTVar3->_vptr_Task[3])(pTVar3);
    case 0:
    case 2:
      ::std::__shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2> *)&task);
    }
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&task.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void TaskScheduler::ExecuteTasks(idx_t max_tasks) {
#ifndef DUCKDB_NO_THREADS
	shared_ptr<Task> task;
	for (idx_t i = 0; i < max_tasks; i++) {
		queue->semaphore.wait(TASK_TIMEOUT_USECS);
		if (!queue->q.try_dequeue(task)) {
			return;
		}
		try {
			auto execute_result = task->Execute(TaskExecutionMode::PROCESS_ALL);
			switch (execute_result) {
			case TaskExecutionResult::TASK_FINISHED:
			case TaskExecutionResult::TASK_ERROR:
				task.reset();
				break;
			case TaskExecutionResult::TASK_NOT_FINISHED:
				throw InternalException("Task should not return TASK_NOT_FINISHED in PROCESS_ALL mode");
			case TaskExecutionResult::TASK_BLOCKED:
				task->Deschedule();
				task.reset();
				break;
			}
		} catch (...) {
			return;
		}
	}
#else
	throw NotImplementedException("DuckDB was compiled without threads! Background thread loop is not allowed.");
#endif
}